

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.h
# Opt level: O0

void aGLTextureUpdate(AGLTexture *tex,AGLTextureData *data)

{
  A__GLTextureFormat AVar1;
  undefined4 local_44;
  code *pcStack_40;
  GLenum binding;
  a__gl_texture_upload_func *upload_func;
  GLenum local_30;
  A__GLTextureFormat tf;
  AGLTextureData *data_local;
  AGLTexture *tex_local;
  
  if (data->type != tex->type) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x42d,"data->type == tex->type");
    aAppTerminate(-1);
  }
  AVar1 = getTextureFormat(data->format);
  local_30 = AVar1.type;
  upload_func = AVar1._0_8_;
  pcStack_40 = (code *)0x0;
  local_44 = 0;
  switch(data->type) {
  case AGLTT_NULL:
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x445,"!\"Invalid texture type\"");
    aAppTerminate(-1);
    break;
  case AGLTT_1D:
    pcStack_40 = a__GLTexureUpload1D;
    local_44 = 0xde0;
    break;
  case AGLTT_2D:
    pcStack_40 = a__GLTexureUpload2D;
    local_44 = 0xde1;
    break;
  case AGLTT_3D:
    pcStack_40 = a__GLTexureUpload3D;
    local_44 = 0x806f;
    break;
  case AGLTT_2DArray:
    pcStack_40 = a__GLTexureUpload3D;
    local_44 = 0x8c1a;
  }
  if (pcStack_40 == (code *)0x0) {
    aAppDebugPrintf("ERROR @ %s:%d: (%s) failed",
                    "/workspace/llm4binary/github/license_c_cmakelists/w23[P]atto/include/atto/gl.h"
                    ,0x447,"upload_func");
    aAppTerminate(-1);
  }
  glBindTexture(local_44,(tex->_).name);
  (*pcStack_40)(tex,data,local_44,upload_func,local_30);
  if ((data->pixels != (void *)0x0) && ((data->flags & 1) != 0)) {
    glGenerateMipmap(local_44);
  }
  tex->format = data->format;
  return;
}

Assistant:

void aGLTextureUpdate(AGLTexture *tex, const AGLTextureData *data) {
	ATTO_ASSERT(data->type == tex->type);

	struct A__GLTextureFormat tf = getTextureFormat(data->format);

	a__gl_texture_upload_func *upload_func = NULL;
	GLenum binding = 0;

	switch (data->type) {
		case AGLTT_1D:
			upload_func = &a__GLTexureUpload1D;
			binding = GL_TEXTURE_1D;
			break;
		case AGLTT_2D:
			upload_func = &a__GLTexureUpload2D;
			binding = GL_TEXTURE_2D;
			break;
		case AGLTT_3D:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_3D;
			break;
		case AGLTT_2DArray:
			upload_func = &a__GLTexureUpload3D;
			binding = GL_TEXTURE_2D_ARRAY;
			break;
		case AGLTT_NULL: ATTO_ASSERT(!"Invalid texture type");
	}
	ATTO_ASSERT(upload_func);

	// TODO track bindings properly
	AGL__CALL(glBindTexture(binding, tex->_.name));

	upload_func(tex, data, binding, tf);

	if (data->pixels && (data->flags & AGLTUF_GenerateMipmaps))
		AGL__CALL(glGenerateMipmap(binding));

	tex->format = data->format;
}